

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_bufstr(ASMState *as,IRIns *ir)

{
  uint local_24;
  CCallInfo *pCStack_20;
  IRRef args [1];
  CCallInfo *ci;
  IRIns *ir_local;
  ASMState *as_local;
  
  pCStack_20 = lj_ir_callinfo + 0x1e;
  local_24 = (uint)(ir->field_0).op1;
  as->gcsteps = as->gcsteps + 1;
  asm_setupresult(as,ir,lj_ir_callinfo + 0x1e);
  asm_gencall(as,pCStack_20,&local_24);
  return;
}

Assistant:

static void asm_bufstr(ASMState *as, IRIns *ir)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_buf_tostr];
  IRRef args[1];
  args[0] = ir->op1;  /* SBuf *sb */
  as->gcsteps++;
  asm_setupresult(as, ir, ci);  /* GCstr * */
  asm_gencall(as, ci, args);
}